

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O0

_Bool btorsim_bv_is_one(BtorSimBitVector *bv)

{
  uint32_t i;
  BtorSimBitVector *bv_local;
  _Bool local_1;
  
  if ((&bv[1].width)[bv->len - 1] == 1) {
    for (i = 0; i < bv->len - 1; i = i + 1) {
      if ((&bv[1].width)[i] != 0) {
        return false;
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool
btorsim_bv_is_one (const BtorSimBitVector *bv)
{
  assert (bv);

  uint32_t i;

  if (bv->bits[bv->len - 1] != 1) return false;
  for (i = 0; i < bv->len - 1; i++)
    if (bv->bits[i] != 0) return false;
  return true;
}